

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

iterator __thiscall QMap<QString,_QVariant>::find(QMap<QString,_QVariant> *this,QString *key)

{
  bool bVar1;
  long in_FS_OFFSET;
  QMap<QString,_QVariant> copy;
  iterator in_stack_ffffffffffffff98;
  QMap<QString,_QVariant> *in_stack_ffffffffffffffa0;
  undefined1 *local_18;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  bVar1 = QtPrivate::
          QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
          ::isShared(&in_stack_ffffffffffffffa0->d);
  if (bVar1) {
    QMap(in_stack_ffffffffffffffa0,(QMap<QString,_QVariant> *)in_stack_ffffffffffffff98._M_node);
  }
  else {
    memset(&local_18,0,8);
    QMap((QMap<QString,_QVariant> *)0x3cf4bd);
  }
  detach(in_stack_ffffffffffffffa0);
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
  ::operator->((QExplicitlySharedDataPointerV2<QMapData<std::map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>_>_>
                *)0x3cf4d3);
  std::
  map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>::
  find((map<QString,_QVariant,_std::less<QString>,_std::allocator<std::pair<const_QString,_QVariant>_>_>
        *)in_stack_ffffffffffffff98._M_node,(key_type *)0x3cf4e4);
  iterator::iterator((iterator *)0x3cf504,in_stack_ffffffffffffff98);
  ~QMap((QMap<QString,_QVariant> *)0x3cf510);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)(iterator)local_10._M_node;
  }
  __stack_chk_fail();
}

Assistant:

iterator find(const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        return iterator(d->m.find(key));
    }